

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_DeleteElementI
              (Var instance,Var index,ScriptContext *scriptContext,
              PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  RecyclableObject *pRVar2;
  ScriptContext *scriptContext_00;
  bool bVar3;
  BOOL BVar4;
  PropertyId PVar5;
  JavascriptString *varName;
  undefined4 *puVar6;
  JavascriptLibrary *pJVar7;
  PropertyRecord *local_68;
  PropertyRecord *debugPropertyRecord;
  JavascriptString *indexStr;
  IndexType indexType;
  BOOL result;
  JavascriptString *propertyNameString;
  PropertyRecord *propertyRecord;
  RecyclableObject *pRStack_38;
  uint32 indexVal;
  RecyclableObject *object;
  ScriptContext *pSStack_28;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *scriptContext_local;
  Var index_local;
  Var instance_local;
  
  object._4_4_ = propertyOperationFlags;
  pSStack_28 = scriptContext;
  scriptContext_local = (ScriptContext *)index;
  index_local = instance;
  bVar3 = TaggedNumber::Is(instance);
  if (bVar3) {
    pJVar7 = ScriptContext::GetLibrary(pSStack_28);
    instance_local = JavascriptLibraryBase::GetTrue(&pJVar7->super_JavascriptLibraryBase);
  }
  else {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(index_local);
    pRStack_38 = VarTo<Js::RecyclableObject>(index_local);
    BVar4 = IsUndefinedOrNull(pRStack_38);
    scriptContext_00 = pSStack_28;
    if (BVar4 != 0) {
      varName = GetPropertyDisplayNameForError(scriptContext_local,pSStack_28);
      JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ec47,varName);
    }
    propertyNameString = (JavascriptString *)0x0;
    _indexType = (JavascriptString *)0x0;
    indexStr._4_4_ = 1;
    indexStr._0_4_ =
         GetIndexType(&scriptContext_local,pSStack_28,(uint32 *)((long)&propertyRecord + 4),
                      (PropertyRecord **)&propertyNameString,(JavascriptString **)&indexType,false,
                      true);
    if ((IndexType)indexStr == IndexType_Number) {
      indexStr._4_4_ = DeleteItem(pRStack_38,propertyRecord._4_4_,object._4_4_);
    }
    else if ((IndexType)indexStr == IndexType_JavascriptString) {
      indexStr._4_4_ = DeleteProperty(pRStack_38,_indexType,object._4_4_);
    }
    else {
      if ((IndexType)indexStr != IndexType_PropertyId) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x14f0,"(indexType == IndexType_PropertyId)",
                                    "indexType == IndexType_PropertyId");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if ((propertyNameString == (JavascriptString *)0x0) &&
         (bVar3 = CanShortcutOnUnknownPropertyName(pRStack_38), !bVar3)) {
        indexStr._0_4_ =
             GetIndexTypeFromPrimitive
                       (scriptContext_local,pSStack_28,(uint32 *)((long)&propertyRecord + 4),
                        (PropertyRecord **)&propertyNameString,true);
        if ((IndexType)indexStr != IndexType_PropertyId) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x14f5,"(indexType == IndexType_PropertyId)",
                                      "indexType == IndexType_PropertyId");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if (propertyNameString == (JavascriptString *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x14f6,"(propertyRecord != nullptr)",
                                      "propertyRecord != nullptr");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
      pRVar2 = pRStack_38;
      if (propertyNameString == (JavascriptString *)0x0) {
        debugPropertyRecord =
             (PropertyRecord *)JavascriptConversion::ToString(scriptContext_local,pSStack_28);
        ScriptContext::GetOrAddPropertyRecord
                  (pSStack_28,(JavascriptString *)debugPropertyRecord,&local_68);
        pRVar2 = pRStack_38;
        PVar5 = PropertyRecord::GetPropertyId(local_68);
        BVar4 = DeleteProperty(pRVar2,PVar5,object._4_4_);
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1503,
                                      "(JavascriptOperators::DeleteProperty(object, debugPropertyRecord->GetPropertyId(), propertyOperationFlags))"
                                      ,
                                      "delete should have been true. See OS Bug 2727708 if you see this come from the web"
                                     );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
      else {
        PVar5 = PropertyRecord::GetPropertyId((PropertyRecord *)propertyNameString);
        indexStr._4_4_ = DeleteProperty(pRVar2,PVar5,object._4_4_);
      }
    }
    if ((indexStr._4_4_ == 0) &&
       ((object._4_4_ & (PropertyOperation_ThrowOnDeleteIfNotConfig|PropertyOperation_StrictMode))
        != PropertyOperation_None)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1508,
                                  "(result || !(propertyOperationFlags & (PropertyOperation_StrictMode | PropertyOperation_ThrowOnDeleteIfNotConfig)))"
                                  ,
                                  "result || !(propertyOperationFlags & (PropertyOperation_StrictMode | PropertyOperation_ThrowOnDeleteIfNotConfig))"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pJVar7 = ScriptContext::GetLibrary(pSStack_28);
    instance_local = JavascriptLibrary::CreateBoolean(pJVar7,indexStr._4_4_);
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::OP_DeleteElementI(Var instance, Var index, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_DeleteElementI);
        if(TaggedNumber::Is(instance))
        {
            return scriptContext->GetLibrary()->GetTrue();
        }

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        RecyclableObject* object = VarTo<RecyclableObject>(instance);
        if (JavascriptOperators::IsUndefinedOrNull(object))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotDelete_NullOrUndefined, GetPropertyDisplayNameForError(index, scriptContext));
        }

        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptString * propertyNameString = nullptr;
        BOOL result = TRUE;
        IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, false, true);

        if (indexType == IndexType_Number)
        {
            result = JavascriptOperators::DeleteItem(object, indexVal, propertyOperationFlags);
        }
        else if (indexType == IndexType_JavascriptString)
        {
            result = JavascriptOperators::DeleteProperty(object, propertyNameString, propertyOperationFlags);
        }
        else
        {
            Assert(indexType == IndexType_PropertyId);

            if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
            {
                indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, true);
                Assert(indexType == IndexType_PropertyId);
                Assert(propertyRecord != nullptr);
            }

            if (propertyRecord != nullptr)
            {
                result = JavascriptOperators::DeleteProperty(object, propertyRecord->GetPropertyId(), propertyOperationFlags);
            }
#if DBG
            else
            {
                JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                PropertyRecord const * debugPropertyRecord;
                scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                AssertMsg(JavascriptOperators::DeleteProperty(object, debugPropertyRecord->GetPropertyId(), propertyOperationFlags), "delete should have been true. See OS Bug 2727708 if you see this come from the web");
            }
#endif
        }

        Assert(result || !(propertyOperationFlags & (PropertyOperation_StrictMode | PropertyOperation_ThrowOnDeleteIfNotConfig)));
        return scriptContext->GetLibrary()->CreateBoolean(result);
        JIT_HELPER_END(Op_DeleteElementI);
    }